

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O2

void __thiscall QPagePreview::paintEvent(QPagePreview *this,QPaintEvent *param_1)

{
  int y1;
  long lVar1;
  undefined4 uVar2;
  QSize QVar3;
  QPalette *pQVar4;
  QBrush *pQVar5;
  QColor *pQVar6;
  int y;
  long in_FS_OFFSET;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar11 [16];
  ulong uVar15;
  undefined1 auVar12 [16];
  double dVar10;
  int iVar14;
  double dVar16;
  undefined1 auVar13 [16];
  int iVar17;
  int iVar19;
  undefined1 auVar18 [16];
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  QRect QVar25;
  QLatin1StringView latin1;
  int local_130;
  double local_108;
  double dStack_100;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  QArrayDataPointer<char16_t> local_d8;
  QPainter p;
  Representation RStack_bc;
  QRect local_b8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  QSizeF local_78;
  QSize local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  auVar24 = QPageLayout::fullRectPoints();
  local_60.wd.m_i = (auVar24._8_4_ - auVar24._0_4_) + 1;
  local_60.ht.m_i = (auVar24._12_4_ - auVar24._4_4_) + 1;
  lVar1 = *(long *)&this->field_0x20;
  QVar3 = QSize::scaled(&local_60,(*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + -9,
                        (*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + -9,KeepAspectRatio);
  local_78.wd = (qreal)QVar3.wd.m_i.m_i;
  local_78.ht = (qreal)QVar3.ht.m_i.m_i;
  QVar3 = QSizeF::toSize(&local_78);
  QVar25 = QWidget::rect(&this->super_QWidget);
  local_98 = 0xffffffff;
  uStack_94 = 0xffffffff;
  uStack_90 = 0xffffffff;
  uStack_8c = 0xffffffff;
  local_a8 = 0xffffffff;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  local_130 = QVar3.wd.m_i.m_i + -1;
  iVar23 = QVar3.ht.m_i.m_i + -1;
  auVar18._0_8_ = QVar25._0_8_;
  auVar18._8_4_ = QVar25.y1.m_i.m_i;
  auVar18._12_4_ = QVar25.y1.m_i.m_i >> 0x1f;
  auVar11._0_8_ = QVar25._8_8_;
  auVar11._8_4_ = QVar25.y2.m_i.m_i;
  auVar11._12_4_ = QVar25.y2.m_i.m_i >> 0x1f;
  uVar9 = (long)QVar25.x2.m_i.m_i + (long)QVar25.x1.m_i.m_i;
  uVar15 = auVar11._8_8_ + auVar18._8_8_;
  iVar17 = (int)((uVar9 >> 1) + (uVar9 >> 0x3f & uVar9)) - local_130 / 2;
  iVar19 = (int)((uVar15 >> 1) + (uVar15 >> 0x3f & uVar15)) - iVar23 / 2;
  local_130 = local_130 + iVar17;
  iVar23 = iVar23 + iVar19;
  auVar24._8_8_ = local_78.ht;
  auVar24._0_8_ = local_78.wd;
  auVar12._0_8_ = (double)local_60.wd.m_i;
  auVar12._8_8_ = (double)local_60.ht.m_i;
  auVar24 = divpd(auVar24,auVar12);
  local_88 = iVar17;
  iStack_84 = iVar19;
  iStack_80 = local_130;
  iStack_7c = iVar23;
  QPageLayout::margins((Unit)&local_a8);
  local_108 = auVar24._0_8_;
  dStack_100 = auVar24._8_8_;
  dVar10 = (double)CONCAT44(uStack_a4,local_a8) * local_108;
  dVar16 = (double)CONCAT44(uStack_9c,uStack_a0) * dStack_100;
  iVar8 = (int)((double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10);
  iVar14 = (int)((double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16);
  local_108 = local_108 * (double)CONCAT44(uStack_94,local_98);
  dStack_100 = dStack_100 * (double)CONCAT44(uStack_8c,uStack_90);
  iVar20 = iVar17 + iVar8;
  iVar21 = iVar19 + iVar14;
  iVar22 = local_130 + iVar8 +
           ((int)((double)((ulong)local_108 & 0x8000000000000000 | 0x3fe0000000000000) + local_108)
            + iVar8 ^ 0xffffffffU);
  iVar14 = iVar23 + iVar14 +
           ((int)((double)((ulong)dStack_100 & 0x8000000000000000 | 0x3fe0000000000000) + dStack_100
                 ) + iVar14 ^ 0xffffffffU);
  _p = -0x55555556;
  RStack_bc.m_i = -0x55555556;
  local_b8.x1.m_i = iVar20;
  local_b8.y1.m_i = iVar21;
  local_b8.x2.m_i = iVar22;
  local_b8.y2.m_i = iVar14;
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  pQVar4 = (QPalette *)QWidget::palette();
  pQVar5 = QPalette::mid(pQVar4);
  local_48 = *(undefined8 *)(*(long *)pQVar5 + 8);
  uStack_40 = *(undefined8 *)(*(long *)pQVar5 + 0x10);
  iVar8 = 0x96;
  while( true ) {
    local_130 = local_130 + 1;
    iVar17 = iVar17 + 1;
    iVar19 = iVar19 + 1;
    if (iVar8 == 0) break;
    QColor::setAlpha((int)&local_48);
    y1 = iVar23 + 1;
    QPainter::setPen((QColor *)&p);
    QPainter::drawLine(&p,iVar17,y1,local_130,y1);
    QPainter::drawLine(&p,local_130,iVar19,local_130,iVar23);
    iVar8 = iVar8 + -0x1e;
    iVar23 = y1;
  }
  pQVar4 = (QPalette *)QWidget::palette();
  QPalette::light(pQVar4);
  uVar2 = QPainter::fillRect((QRect *)&p,(QBrush *)&local_88);
  auVar13._0_4_ = -(uint)(iVar22 < iVar20);
  iVar19 = -(uint)(iVar14 < iVar21);
  auVar13._4_4_ = auVar13._0_4_;
  auVar13._8_4_ = iVar19;
  auVar13._12_4_ = iVar19;
  iVar19 = movmskpd(uVar2,auVar13);
  if (iVar19 == 0) {
    pQVar4 = (QPalette *)QWidget::palette();
    pQVar6 = QPalette::color(pQVar4,Dark);
    QBrush::QBrush((QBrush *)&local_58,pQVar6,SolidPattern);
    iVar19 = 3;
    QPen::QPen((QPen *)0x0,&local_d8,(QBrush *)&local_58,3,0x10,0x40);
    QPainter::setPen((QPen *)&p);
    QPen::~QPen((QPen *)&local_d8);
    QBrush::~QBrush((QBrush *)&local_58);
    QPainter::drawRect(&p,&local_b8);
    local_b8.x1.m_i = local_b8.x1.m_i + 2;
    local_b8.y1.m_i = local_b8.y1.m_i + 2;
    local_b8.x2.m_i = local_b8.x2.m_i + -1;
    local_b8.y2.m_i = local_b8.y2.m_i + -1;
    QPainter::setClipRect((QRect *)&p,(ClipOperation)&local_b8);
    local_58 = 0xaaaaaaaaaaaaaaaa;
    uStack_50 = 0xaaaaaaaaaaaaaaaa;
    QFont::QFont((QFont *)&local_58);
    dVar10 = (double)QFont::pointSizeF();
    QFont::setPointSizeF(dVar10 * 0.25);
    QPainter::setFont((QFont *)&p);
    pQVar4 = (QPalette *)QWidget::palette();
    QPalette::color(pQVar4,Dark);
    QPainter::setPen((QColor *)&p);
    local_d8.size = -0x5555555555555556;
    local_d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_d8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    latin1.m_data =
         "Lorem ipsum dolor sit amet, consectetuer adipiscing elit, sed diam nonummy nibh euismod tincidunt ut laoreet dolore magna aliquam erat volutpat. Ut wisi enim ad minim veniam, quis nostrud exerci tation ullamcorper suscipit lobortis nisl ut aliquip ex ea commodo consequat. Duis autem vel eum iriure dolor in hendrerit in vulputate velit esse molestie consequat, vel illum dolore eu feugiat nulla facilisis at vero eros et accumsan et iusto odio dignissim qui blandit praesent luptatum zzril delenit augue duis dolore te feugait nulla facilisi."
    ;
    latin1.m_size = 0x21f;
    QString::QString((QString *)&local_d8,latin1);
    while (bVar7 = iVar19 != 0, iVar19 = iVar19 + -1, bVar7) {
      QString::append((QString *)&local_d8);
    }
    iVar14 = (int)((double)((iStack_80 - local_88) + 1) * 0.1);
    iVar19 = this->m_pagePreviewColumns;
    iVar23 = this->m_pagePreviewRows;
    iVar8 = ((1 - iVar19) * iVar14 + (local_b8.x2.m_i - local_b8.x1.m_i) + 1) / iVar19;
    iVar20 = ((local_b8.y2.m_i - local_b8.y1.m_i) + (1 - iVar23) * iVar14 + 1) / iVar23;
    for (iVar17 = 0; iVar17 < iVar19; iVar17 = iVar17 + 1) {
      iVar19 = 0;
      for (iVar21 = 0; iVar21 < iVar23; iVar21 = iVar21 + 1) {
        local_e8 = local_b8.x1.m_i + iVar17 * (iVar8 + iVar14);
        local_e4 = local_b8.y1.m_i + iVar19;
        local_e0 = local_e8 + iVar8 + -1;
        local_dc = local_e4 + iVar20 + -1;
        QPainter::drawText((QRect *)&p,(int)&local_e8,(QString *)0x1080,(QRect *)&local_d8);
        iVar23 = this->m_pagePreviewRows;
        iVar19 = iVar19 + iVar14 + iVar20;
      }
      iVar19 = this->m_pagePreviewColumns;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QFont::~QFont((QFont *)&local_58);
  }
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent *) override
    {
        QSize pageSize = m_pageLayout.fullRectPoints().size();
        QSizeF scaledSize = pageSize.scaled(width() - 10, height() - 10, Qt::KeepAspectRatio);
        QRect pageRect = QRect(QPoint(0,0), scaledSize.toSize());
        pageRect.moveCenter(rect().center());
        qreal width_factor = scaledSize.width() / pageSize.width();
        qreal height_factor = scaledSize.height() / pageSize.height();
        QMarginsF margins = m_pageLayout.margins(QPageLayout::Point);
        int left = qRound(margins.left() * width_factor);
        int top = qRound(margins.top() * height_factor);
        int right = qRound(margins.right() * width_factor);
        int bottom = qRound(margins.bottom() * height_factor);
        QRect marginRect(pageRect.x() + left, pageRect.y() + top,
                         pageRect.width() - (left + right + 1), pageRect.height() - (top + bottom + 1));

        QPainter p(this);
        QColor shadow(palette().mid().color());
        for (int i=1; i<6; ++i) {
            shadow.setAlpha(180-i*30);
            QRect offset(pageRect.adjusted(i, i, i, i));
            p.setPen(shadow);
            p.drawLine(offset.left(), offset.bottom(), offset.right(), offset.bottom());
            p.drawLine(offset.right(), offset.top(), offset.right(), offset.bottom()-1);
        }
        p.fillRect(pageRect, palette().light());

        if (marginRect.isValid()) {
            p.setPen(QPen(palette().color(QPalette::Dark), 0, Qt::DotLine));
            p.drawRect(marginRect);

            marginRect.adjust(2, 2, -1, -1);
            p.setClipRect(marginRect);
            QFont font;
            font.setPointSizeF(font.pointSizeF()*0.25);
            p.setFont(font);
            p.setPen(palette().color(QPalette::Dark));
            QString text("Lorem ipsum dolor sit amet, consectetuer adipiscing elit, sed diam nonummy nibh euismod tincidunt ut laoreet dolore magna aliquam erat volutpat. Ut wisi enim ad minim veniam, quis nostrud exerci tation ullamcorper suscipit lobortis nisl ut aliquip ex ea commodo consequat. Duis autem vel eum iriure dolor in hendrerit in vulputate velit esse molestie consequat, vel illum dolore eu feugiat nulla facilisis at vero eros et accumsan et iusto odio dignissim qui blandit praesent luptatum zzril delenit augue duis dolore te feugait nulla facilisi."_L1);
            for (int i=0; i<3; ++i)
                text += text;

            const int spacing = pageRect.width() * 0.1;
            const int textWidth = (marginRect.width() - (spacing * (m_pagePreviewColumns-1))) / m_pagePreviewColumns;
            const int textHeight = (marginRect.height() - (spacing * (m_pagePreviewRows-1))) / m_pagePreviewRows;

            for (int x = 0 ; x < m_pagePreviewColumns; ++x) {
                for (int y = 0 ; y < m_pagePreviewRows; ++y) {
                    QRect textRect(marginRect.left() + x * (textWidth + spacing),
                                   marginRect.top() + y * (textHeight + spacing),
                                   textWidth, textHeight);
                    p.drawText(textRect, Qt::TextWordWrap|Qt::AlignVCenter, text);
                }
            }
        }
    }